

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

FeatureDescriptor * __thiscall
cmComputeLinkInformation::GetGroupFeature(cmComputeLinkInformation *this,string *feature)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  _Base_ptr p_Var4;
  cmake *pcVar5;
  cmGlobalGenerator *pcVar6;
  cmLocalGenerator *pcVar7;
  bool bVar8;
  iterator iVar9;
  cmValue cVar10;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>
  _Var11;
  string *psVar12;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar13;
  element_type *peVar14;
  _Base_ptr p_Var15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_bool>
  pVar16;
  string featureName;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  items;
  string local_1a0;
  undefined1 local_180 [16];
  undefined1 local_170 [32];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  _Base_ptr local_130;
  undefined1 local_128 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Base_ptr local_d8;
  _Base_ptr local_d0;
  string local_c8;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  string local_90;
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  
  this_00 = &this->GroupFeatureDescriptors;
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
          ::find(&this_00->_M_t,feature);
  if ((_Rb_tree_header *)iVar9._M_node !=
      &(this->GroupFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
    p_Var15 = iVar9._M_node + 1;
    goto LAB_00379657;
  }
  local_170._8_8_ = (this->LinkLanguage)._M_dataplus._M_p;
  local_170._0_8_ = (this->LinkLanguage)._M_string_length;
  local_180._0_8_ = (element_type *)0x6;
  local_180._8_8_ = "CMAKE_";
  local_170._16_8_ = (pointer)0x12;
  local_170._24_8_ = (long)"CMAKE_LINK_GROUP_USING_" + 5;
  local_150._8_8_ = (feature->_M_dataplus)._M_p;
  local_150._0_8_ = feature->_M_string_length;
  views._M_len = 4;
  views._M_array = (iterator)local_180;
  cmCatViews_abi_cxx11_(&local_c8,views);
  pcVar2 = this->Makefile;
  local_180._0_8_ = local_c8._M_string_length;
  local_180._8_8_ = local_c8._M_dataplus._M_p;
  local_170._0_8_ = (cmLocalGenerator *)0xa;
  local_170._8_8_ = (long)"CMAKE_CUDA_PIE_SUPPORTED" + 0xe;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_180;
  cmCatViews_abi_cxx11_(&local_1a0,views_00);
  cVar10 = cmMakefile::GetDefinition(pcVar2,&local_1a0);
  paVar1 = &local_1a0.field_2;
  pcVar13 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    pcVar13 = extraout_RDX_00;
  }
  if (cVar10.Value == (string *)0x0) {
    local_170._8_8_ = (feature->_M_dataplus)._M_p;
    local_170._0_8_ = feature->_M_string_length;
    local_180._0_8_ = (element_type *)0x17;
    local_180._8_8_ = "CMAKE_LINK_GROUP_USING_";
    views_01._M_len = 2;
    views_01._M_array = (iterator)local_180;
    cmCatViews_abi_cxx11_(&local_1a0,views_01);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = this->Makefile;
    local_180._0_8_ = local_c8._M_string_length;
    local_180._8_8_ = local_c8._M_dataplus._M_p;
    local_170._0_8_ = (cmLocalGenerator *)0xa;
    local_170._8_8_ = (long)"CMAKE_CUDA_PIE_SUPPORTED" + 0xe;
    views_02._M_len = 2;
    views_02._M_array = (iterator)local_180;
    cmCatViews_abi_cxx11_(&local_1a0,views_02);
    cVar10 = cmMakefile::GetDefinition(pcVar2,&local_1a0);
    pcVar13 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      pcVar13 = extraout_RDX_02;
    }
  }
  local_d8 = (_Base_ptr)this_00;
  local_d0 = (_Base_ptr)feature;
  if ((cVar10.Value == (string *)0x0) ||
     (value._M_str = pcVar13, value._M_len = (size_t)((cVar10.Value)->_M_dataplus)._M_p,
     bVar8 = cmValue::IsOn((cmValue *)(cVar10.Value)->_M_string_length,value), !bVar8)) {
    pcVar5 = this->CMakeInstance;
    pcVar6 = (cmGlobalGenerator *)(feature->_M_dataplus)._M_p;
    pcVar7 = (cmLocalGenerator *)feature->_M_string_length;
    psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    local_180._0_8_ = (element_type *)0x9;
    local_180._8_8_ = "Feature \'";
    local_170._16_8_ = (pointer)0x4a;
    local_170._24_8_ =
         "\', specified through generator-expression \'$<LINK_GROUP>\' to link target \'";
    local_150._8_8_ = (psVar12->_M_dataplus)._M_p;
    local_150._0_8_ = psVar12->_M_string_length;
    local_140._0_8_ = 0x1d;
    local_140._8_8_ = "\', is not supported for the \'";
    local_128._0_8_ = (this->LinkLanguage)._M_dataplus._M_p;
    local_130 = (_Base_ptr)(this->LinkLanguage)._M_string_length;
    local_128._8_8_ = (_Base_ptr)0x10;
    local_128._16_8_ = "\' link language.";
    views_03._M_len = 7;
    views_03._M_array = (iterator)local_180;
    local_170._0_8_ = pcVar7;
    local_170._8_8_ = pcVar6;
    cmCatViews_abi_cxx11_(&local_1a0,views_03);
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_180);
    cmake::IssueMessage(pcVar5,FATAL_ERROR,&local_1a0,(cmListFileBacktrace *)local_180);
    if ((cmMakefile *)local_180._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    memset(local_180,0,0xa8);
    local_180._0_8_ = local_170;
    local_180._8_8_ = (cmMakefile *)0x0;
    local_170._0_8_ = local_170._0_8_ & 0xffffffffffffff00;
    local_170._16_8_ = local_170._16_8_ & 0xffffffffffffff00;
    local_170._24_8_ = local_150 + 8;
    local_150._0_8_ = 0;
    local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
    local_140._8_8_ = local_128;
    local_130 = (_Base_ptr)0x0;
    local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
    local_128._16_8_ = &local_108;
    local_128._24_8_ = 0;
    local_108._M_local_buf[0] = '\0';
    local_f8._M_allocated_capacity = (size_type)&local_e8;
    local_f8._8_8_ = 0;
    local_e8._M_local_buf[0] = '\0';
    pVar16 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
             ::
             _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                         *)local_d8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_d0,(FeatureDescriptor *)local_180);
    _Var11 = pVar16.first._M_node;
LAB_003795ad:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_allocated_capacity != &local_e8) {
      operator_delete((void *)local_f8._M_allocated_capacity,
                      CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._16_8_ != &local_108) {
      operator_delete((void *)local_128._16_8_,
                      CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_140._8_8_ != local_128) {
      operator_delete((void *)local_140._8_8_,(ulong)(local_128._0_8_ + 1));
    }
    if ((undefined1 *)local_170._24_8_ != local_150 + 8) {
      operator_delete((void *)local_170._24_8_,(ulong)(local_150._8_8_ + 1));
    }
    if ((element_type *)local_180._0_8_ != (element_type *)local_170) {
      operator_delete((void *)local_180._0_8_,(ulong)(local_170._0_8_ + 1));
    }
  }
  else {
    cVar10 = cmMakefile::GetDefinition(this->Makefile,&local_c8);
    if (cVar10.Value == (string *)0x0) {
      pcVar5 = this->CMakeInstance;
      pcVar6 = (cmGlobalGenerator *)(feature->_M_dataplus)._M_p;
      pcVar7 = (cmLocalGenerator *)feature->_M_string_length;
      psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      local_180._0_8_ = (element_type *)0x9;
      local_180._8_8_ = "Feature \'";
      local_170._16_8_ = (pointer)0x4a;
      local_170._24_8_ =
           "\', specified through generator-expression \'$<LINK_GROUP>\' to link target \'";
      local_150._8_8_ = (psVar12->_M_dataplus)._M_p;
      local_150._0_8_ = psVar12->_M_string_length;
      local_140._0_8_ = 0x1b;
      local_140._8_8_ = "\', is not defined for the \'";
      local_128._0_8_ = (this->LinkLanguage)._M_dataplus._M_p;
      local_130 = (_Base_ptr)(this->LinkLanguage)._M_string_length;
      local_128._8_8_ = (_Base_ptr)0x10;
      local_128._16_8_ = "\' link language.";
      views_04._M_len = 7;
      views_04._M_array = (iterator)local_180;
      local_170._0_8_ = pcVar7;
      local_170._8_8_ = pcVar6;
      cmCatViews_abi_cxx11_(&local_1a0,views_04);
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_180);
      cmake::IssueMessage(pcVar5,FATAL_ERROR,&local_1a0,(cmListFileBacktrace *)local_180);
      if ((cmMakefile *)local_180._8_8_ != (cmMakefile *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      memset(local_180,0,0xa8);
      local_180._0_8_ = local_170;
      local_180._8_8_ = (cmMakefile *)0x0;
      local_170._0_8_ = local_170._0_8_ & 0xffffffffffffff00;
      local_170._16_8_ = local_170._16_8_ & 0xffffffffffffff00;
      local_170._24_8_ = local_150 + 8;
      local_150._0_8_ = 0;
      local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
      local_140._8_8_ = local_128;
      local_130 = (_Base_ptr)0x0;
      local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
      local_128._16_8_ = &local_108;
      local_128._24_8_ = 0;
      local_108._M_local_buf[0] = '\0';
      local_f8._M_allocated_capacity = (size_type)&local_e8;
      local_f8._8_8_ = 0;
      local_e8._M_local_buf[0] = '\0';
      pVar16 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
               ::
               _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                           *)local_d8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d0,(FeatureDescriptor *)local_180);
      _Var11 = pVar16.first._M_node;
      goto LAB_003795ad;
    }
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_180);
    cmExpandListWithBacktrace(&local_a8,cVar10.Value,(cmListFileBacktrace *)local_180,true);
    if ((cmMakefile *)local_180._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_);
    }
    cmGeneratorTarget::ResolveLinkerWrapper(this->Target,&local_a8,&this->LinkLanguage,true);
    if ((long)local_a8.
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_a8.
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x60) {
      pcVar3 = (feature->_M_dataplus)._M_p;
      local_50._0_8_ = (element_type *)(local_50 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar3,pcVar3 + feature->_M_string_length);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar3 = ((local_a8.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->Value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar3,
                 (pointer)((long)&((_Base_ptr)
                                  ((local_a8.
                                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->Value).
                                  _M_string_length)->_M_color + (long)pcVar3));
      p_Var4 = (_Base_ptr)
               local_a8.
               super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].Value._M_dataplus._M_p;
      local_70._0_8_ = (_Base_ptr)(local_70 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,p_Var4,
                 (long)&p_Var4->_M_color +
                 (long)&((_Base_ptr)
                        local_a8.
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].Value._M_string_length)->
                        _M_color);
      GroupFeatureDescriptor::GroupFeatureDescriptor
                ((GroupFeatureDescriptor *)local_180,(string *)local_50,&local_90,(string *)local_70
                );
      pVar16 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
               ::
               _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::GroupFeatureDescriptor>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                           *)this_00,feature,(GroupFeatureDescriptor *)local_180);
      _Var11 = pVar16.first._M_node;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_allocated_capacity != &local_e8) {
        operator_delete((void *)local_f8._M_allocated_capacity,
                        CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._16_8_ != &local_108) {
        operator_delete((void *)local_128._16_8_,
                        CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) +
                        1);
      }
      if ((undefined1 *)local_140._8_8_ != local_128) {
        operator_delete((void *)local_140._8_8_,(ulong)(local_128._0_8_ + 1));
      }
      if ((undefined1 *)local_170._24_8_ != local_150 + 8) {
        operator_delete((void *)local_170._24_8_,(ulong)(local_150._8_8_ + 1));
      }
      if ((element_type *)local_180._0_8_ != (element_type *)local_170) {
        operator_delete((void *)local_180._0_8_,(ulong)(local_170._0_8_ + 1));
      }
      if ((_Base_ptr)local_70._0_8_ != (_Base_ptr)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      peVar14 = (element_type *)local_50._0_8_;
      if ((element_type *)local_50._0_8_ != (element_type *)(local_50 + 0x10)) {
LAB_003799f6:
        operator_delete(peVar14,(ulong)((long)&((cmLocalGenerator *)local_50._16_8_)->
                                               _vptr_cmLocalGenerator + 1));
      }
    }
    else {
      pcVar5 = this->CMakeInstance;
      pcVar6 = (cmGlobalGenerator *)(feature->_M_dataplus)._M_p;
      pcVar7 = (cmLocalGenerator *)feature->_M_string_length;
      psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      local_180._0_8_ = (element_type *)0x9;
      local_180._8_8_ = "Feature \'";
      local_170._16_8_ = (pointer)0x1a;
      local_170._24_8_ = "\', specified by variable \'";
      local_150._0_8_ = local_c8._M_string_length;
      local_150._8_8_ = local_c8._M_dataplus._M_p;
      local_140._0_8_ = 0x4e;
      local_140._8_8_ =
           "\', is malformed (wrong number of elements) and cannot be used to link target \'";
      local_128._0_8_ = (psVar12->_M_dataplus)._M_p;
      local_130 = (_Base_ptr)psVar12->_M_string_length;
      local_128._8_8_ = &DAT_00000002;
      local_128._16_8_ = (long)"\nmay not start with \'-\'." + 0x16;
      views_05._M_len = 7;
      views_05._M_array = (iterator)local_180;
      local_170._0_8_ = pcVar7;
      local_170._8_8_ = pcVar6;
      cmCatViews_abi_cxx11_(&local_1a0,views_05);
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_180);
      cmake::IssueMessage(pcVar5,FATAL_ERROR,&local_1a0,(cmListFileBacktrace *)local_180);
      if ((cmMakefile *)local_180._8_8_ != (cmMakefile *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      memset(local_180,0,0xa8);
      local_180._8_8_ = (cmMakefile *)0x0;
      local_170._0_8_ = local_170._0_8_ & 0xffffffffffffff00;
      local_170._16_8_ = local_170._16_8_ & 0xffffffffffffff00;
      local_150._0_8_ = 0;
      local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
      local_130 = (_Base_ptr)0x0;
      local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
      local_128._24_8_ = 0;
      local_108._M_local_buf[0] = '\0';
      local_f8._8_8_ = 0;
      local_e8._M_local_buf[0] = '\0';
      local_180._0_8_ = (element_type *)local_170;
      local_170._24_8_ = local_150 + 8;
      local_140._8_8_ = local_128;
      local_128._16_8_ = &local_108;
      local_f8._M_allocated_capacity = (size_type)&local_e8;
      pVar16 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
               ::
               _M_emplace_unique<std::__cxx11::string_const&,cmComputeLinkInformation::FeatureDescriptor>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>,std::_Select1st<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmComputeLinkInformation::FeatureDescriptor>>>
                           *)local_d8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d0,(FeatureDescriptor *)local_180);
      _Var11 = pVar16.first._M_node;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_allocated_capacity != &local_e8) {
        operator_delete((void *)local_f8._M_allocated_capacity,
                        CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0]) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._16_8_ != &local_108) {
        operator_delete((void *)local_128._16_8_,
                        CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) +
                        1);
      }
      if ((undefined1 *)local_140._8_8_ != local_128) {
        operator_delete((void *)local_140._8_8_,(ulong)(local_128._0_8_ + 1));
      }
      if ((undefined1 *)local_170._24_8_ != local_150 + 8) {
        operator_delete((void *)local_170._24_8_,(ulong)(local_150._8_8_ + 1));
      }
      local_50._16_8_ = local_170._0_8_;
      peVar14 = (element_type *)local_180._0_8_;
      if ((element_type *)local_180._0_8_ != (element_type *)local_170) goto LAB_003799f6;
    }
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_a8);
  }
  p_Var15 = _Var11._M_node + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
LAB_00379657:
  return (FeatureDescriptor *)(p_Var15 + 1);
}

Assistant:

cmComputeLinkInformation::FeatureDescriptor const&
cmComputeLinkInformation::GetGroupFeature(std::string const& feature)
{
  auto it = this->GroupFeatureDescriptors.find(feature);
  if (it != this->GroupFeatureDescriptors.end()) {
    return it->second;
  }

  auto featureName =
    cmStrCat("CMAKE_", this->LinkLanguage, "_LINK_GROUP_USING_", feature);
  cmValue featureSupported =
    this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  if (!featureSupported) {
    // language specific variable is not defined, fallback to the more generic
    // one
    featureName = cmStrCat("CMAKE_LINK_GROUP_USING_", feature);
    featureSupported =
      this->Makefile->GetDefinition(cmStrCat(featureName, "_SUPPORTED"));
  }
  if (!featureSupported.IsOn()) {
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature,
               "', specified through generator-expression '$<LINK_GROUP>' to "
               "link target '",
               this->Target->GetName(), "', is not supported for the '",
               this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());
    return this->GroupFeatureDescriptors.emplace(feature, FeatureDescriptor{})
      .first->second;
  }

  cmValue langFeature = this->Makefile->GetDefinition(featureName);
  if (!langFeature) {
    this->CMakeInstance->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Feature '", feature,
               "', specified through generator-expression '$<LINK_GROUP>' to "
               "link target '",
               this->Target->GetName(), "', is not defined for the '",
               this->LinkLanguage, "' link language."),
      this->Target->GetBacktrace());
    return this->GroupFeatureDescriptors.emplace(feature, FeatureDescriptor{})
      .first->second;
  }

  auto items =
    cmExpandListWithBacktrace(langFeature, this->Target->GetBacktrace(), true);

  // replace LINKER: pattern
  this->Target->ResolveLinkerWrapper(items, this->LinkLanguage, true);

  if (items.size() == 2) {
    return this->GroupFeatureDescriptors
      .emplace(
        feature,
        GroupFeatureDescriptor{ feature, items[0].Value, items[1].Value })
      .first->second;
  }

  this->CMakeInstance->IssueMessage(
    MessageType::FATAL_ERROR,
    cmStrCat("Feature '", feature, "', specified by variable '", featureName,
             "', is malformed (wrong number of elements) and cannot be used "
             "to link target '",
             this->Target->GetName(), "'."),
    this->Target->GetBacktrace());
  return this->GroupFeatureDescriptors.emplace(feature, FeatureDescriptor{})
    .first->second;
}